

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

int strcmp(char *__s1,char *__s2)

{
  char cVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    cVar1 = __s1[lVar2];
    if (cVar1 != __s2[lVar2]) {
      return (int)cVar1 - (int)__s2[lVar2];
    }
    if (cVar1 == '\0') break;
    lVar2 = lVar2 + 1;
  }
  return 0;
}

Assistant:

int strcmp(const char *lhs, const char *rhs) {
    for (; *lhs == *rhs; ++lhs, ++rhs) {
        if (*lhs == '\0') {
            return 0;
        }
    }
    const int res = *lhs - *rhs;
    return res;
}